

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O2

void tyti::stl::write_ascii<double,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<double> *s)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  bool bVar8;
  
  pbVar6 = out + 0x10;
  poVar1 = std::operator<<((ostream *)pbVar6,"solid ");
  poVar1 = std::operator<<(poVar1,(string *)s);
  std::operator<<(poVar1,"\n");
  uVar2 = ((long)(s->normals).
                 super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(s->normals).
                super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  lVar5 = 0;
  uVar3 = (ulong)(((long)(s->vertices).
                         super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(s->vertices).
                        super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18) / 3;
  if (uVar3 < uVar2) {
    uVar2 = uVar3;
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    std::operator<<((ostream *)pbVar6,"\tfacet normal ");
    poVar1 = std::ostream::_M_insert<double>
                       ((s->normals).
                        super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].data[0]);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>
                       ((s->normals).
                        super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].data[1]);
    std::operator<<(poVar1," ");
    poVar1 = std::ostream::_M_insert<double>
                       ((s->normals).
                        super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].data[2]);
    poVar1 = std::operator<<(poVar1," ");
    std::operator<<(poVar1,"\n");
    std::operator<<((ostream *)pbVar6,"\t\touter loop\n");
    lVar7 = 3;
    lVar4 = lVar5;
    while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
      std::operator<<((ostream *)pbVar6,"\t\t\tvertex ");
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)((s->vertices).
                                   super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data + lVar4));
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)((s->vertices).
                                   super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data + lVar4 + 8));
      std::operator<<(poVar1," ");
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)((s->vertices).
                                   super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->data + lVar4 + 0x10))
      ;
      poVar1 = std::operator<<(poVar1," ");
      std::operator<<(poVar1,"\n");
      lVar4 = lVar4 + 0x18;
    }
    poVar1 = std::operator<<((ostream *)pbVar6,"\t\tendloop\n");
    std::operator<<(poVar1,"\tendfacet\n");
    lVar5 = lVar5 + 0x48;
  }
  poVar1 = std::operator<<((ostream *)pbVar6,"endsolid ");
  poVar1 = std::operator<<(poVar1,(string *)s);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void write_ascii(streamT& out, const basic_solid<T>&s)
        {
            out << "solid " << s.header << "\n";
            
            const size_t num_vertices = std::min(s.normals.size(), s.vertices.size()/3);

            for (size_t i = 0; i < num_vertices; ++i)
            {
                out << "\tfacet normal "
                    << s.normals[i][0] << " "
                    << s.normals[i][1] << " "
                    << s.normals[i][2] << " "
                    << "\n";

                out << "\t\touter loop\n";
                for (size_t j = 0; j < 3; ++j)
                {
                    out << "\t\t\tvertex "
                        << s.vertices[3 * i + j][0] << " "
                        << s.vertices[3 * i + j][1] << " "
                        << s.vertices[3 * i + j][2] << " "
                        << "\n";
                }
                out << "\t\tendloop\n"
                    << "\tendfacet\n";
            }
            out << "endsolid " << s.header << "\n";
        }